

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ExpectedPrefixesCollector::ConsumeLine
          (ExpectedPrefixesCollector *this,StringPiece *line,string *out_error)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  stringpiece_ssize_type sVar1;
  mapped_type *this_01;
  ulong len;
  string *this_02;
  allocator local_b1;
  string local_b0;
  StringPiece prefix;
  StringPiece package;
  string local_50;
  
  sVar1 = StringPiece::find(line,'=',0);
  len = (ulong)(int)sVar1;
  if (len == 0xffffffffffffffff) {
    std::__cxx11::string::string
              ((string *)&package,"Expected prefixes file line without equal sign: \'",&local_b1);
    StringPiece::ToString_abi_cxx11_((string *)&prefix,line);
    std::operator+(&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&package,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prefix);
    std::operator+(&local_50,&local_b0,"\'.");
    std::__cxx11::string::operator=((string *)out_error,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&prefix);
    this_02 = (string *)&package;
  }
  else {
    StringPiece::StringPiece(&package,*line,0,len);
    StringPiece::StringPiece
              (&prefix,*line,(sVar1 << 0x20) + 0x100000000 >> 0x20,~len + line->length_);
    StringPieceTrimWhitespace(&package);
    StringPieceTrimWhitespace(&prefix);
    StringPiece::ToString_abi_cxx11_(&local_50,&prefix);
    this_00 = this->prefix_map_;
    StringPiece::ToString_abi_cxx11_(&local_b0,&package);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,&local_b0);
    this_02 = &local_50;
    std::__cxx11::string::operator=((string *)this_01,(string *)this_02);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::~string((string *)this_02);
  return len != 0xffffffffffffffff;
}

Assistant:

bool ExpectedPrefixesCollector::ConsumeLine(
    const StringPiece& line, string* out_error) {
  int offset = line.find('=');
  if (offset == StringPiece::npos) {
    *out_error =
        string("Expected prefixes file line without equal sign: '") +
        line.ToString() + "'.";
    return false;
  }
  StringPiece package(line, 0, offset);
  StringPiece prefix(line, offset + 1, line.length() - offset - 1);
  StringPieceTrimWhitespace(&package);
  StringPieceTrimWhitespace(&prefix);
  // Don't really worry about error checking the package/prefix for
  // being valid.  Assume the file is validated when it is created/edited.
  (*prefix_map_)[package.ToString()] = prefix.ToString();
  return true;
}